

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O0

int annotation_final_check(lys_ext_instance *ext)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  lys_type *type;
  lys_submodule *submod;
  lys_module *mod;
  uint8_t c;
  uint8_t j;
  uint8_t i;
  lys_ext_instance *ext_local;
  
  puVar3 = (undefined8 *)lys_ext_complex_get_substmt(0x30,ext,0);
  if (*(int *)*puVar3 == 9) {
    lyext_log(ext->module->ctx,0,"Annotations","annotation_final_check",
              "The leafref type is not supported for annotations (annotation %s).",ext->arg_value);
    ext_local._4_4_ = 1;
  }
  else if ((ext->flags & 0x100) == 0) {
    lVar4 = lys_main_module(ext->parent);
    mod._5_1_ = 0;
    for (mod._7_1_ = 0; mod._7_1_ < *(byte *)(lVar4 + 0x50); mod._7_1_ = mod._7_1_ + 1) {
      if (((lys_ext *)**(long **)(*(long *)(lVar4 + 0xa0) + (ulong)mod._7_1_ * 8) == ext->def) &&
         (*(char **)(*(long *)(*(long *)(lVar4 + 0xa0) + (ulong)mod._7_1_ * 8) + 0x10) ==
          ext->arg_value)) {
        if (*(lys_ext_instance **)(*(long *)(lVar4 + 0xa0) + (ulong)mod._7_1_ * 8) != ext) {
          lVar1 = *(long *)(*(long *)(lVar4 + 0xa0) + (ulong)mod._7_1_ * 8);
          *(ushort *)(lVar1 + 0x18) = *(ushort *)(lVar1 + 0x18) | 0x100;
        }
        mod._5_1_ = mod._5_1_ + 1;
      }
    }
    for (mod._6_1_ = 0; mod._6_1_ < *(byte *)(lVar4 + 0x46); mod._6_1_ = mod._6_1_ + 1) {
      lVar1 = *(long *)(*(long *)(lVar4 + 0x68) + (ulong)mod._6_1_ * 0x30);
      for (mod._7_1_ = 0; mod._7_1_ < *(byte *)(lVar1 + 0x50); mod._7_1_ = mod._7_1_ + 1) {
        if (((lys_ext *)**(long **)(*(long *)(lVar1 + 0xa0) + (ulong)mod._7_1_ * 8) == ext->def) &&
           (*(char **)(*(long *)(*(long *)(lVar1 + 0xa0) + (ulong)mod._7_1_ * 8) + 0x10) ==
            ext->arg_value)) {
          if (*(lys_ext_instance **)(*(long *)(lVar1 + 0xa0) + (ulong)mod._7_1_ * 8) != ext) {
            lVar2 = *(long *)(*(long *)(lVar1 + 0xa0) + (ulong)mod._7_1_ * 8);
            *(ushort *)(lVar2 + 0x18) = *(ushort *)(lVar2 + 0x18) | 0x100;
          }
          mod._5_1_ = mod._5_1_ + 1;
        }
      }
    }
    if (mod._5_1_ < 2) {
      ext_local._4_4_ = 0;
    }
    else {
      lyext_log(ext->module->ctx,0,"Annotations","annotation_final_check",
                "Annotation instance %s is not unique, there are %d instances with the same name in module %s."
                ,ext->arg_value,mod._5_1_,*(undefined8 *)((long)ext->parent + 8));
      ext_local._4_4_ = 1;
    }
  }
  else {
    ext->flags = ext->flags & 0xfeff;
    ext_local._4_4_ = 0;
  }
  return ext_local._4_4_;
}

Assistant:

int
annotation_final_check(struct lys_ext_instance *ext)
{
    uint8_t  i, j, c;
    struct lys_module *mod;
    struct lys_submodule *submod;
    struct lys_type *type;

    /*
     * check type - leafref is not allowed
     */
    type = *(struct lys_type**)lys_ext_complex_get_substmt(LY_STMT_TYPE, (struct lys_ext_instance_complex *)ext, NULL);
    if (type->base == LY_TYPE_LEAFREF) {
        LYEXT_LOG(ext->module->ctx, LY_LLERR, "Annotations", "The leafref type is not supported for annotations (annotation %s).",
                  ext->arg_value);
        return 1;
    }

    /*
     * check duplication
     */
    if (ext->flags & LYEXT_OPT_PLUGIN1) {
        /* already checked */
        ext->flags &= ~LYEXT_OPT_PLUGIN1;
        return 0;
    }

    mod = lys_main_module((struct lys_module *)ext->parent);

    for (i = c = 0; i < mod->ext_size; i++) {
        /* note, that it is not necessary to check also ext->insubstmt since
         * annotation_position() ensures that annotation instances are placed only
         * in module or submodule */
        if (mod->ext[i]->def == ext->def && mod->ext[i]->arg_value == ext->arg_value) {
            if (mod->ext[i] != ext) {
                /* do not mark the instance being checked */
                mod->ext[i]->flags |= LYEXT_OPT_PLUGIN1;
            }
            c++;
        }
    }
    /* similarly, go through the all extensions in the main module submodules */
    for (j = 0; j < mod->inc_size; j++) {
        submod = mod->inc[j].submodule; /* shortcut */
        for (i = 0; i < submod->ext_size; i++) {
            if (submod->ext[i]->def == ext->def && submod->ext[i]->arg_value == ext->arg_value) {
                if (submod->ext[i] != ext) {
                    /* do not mark the instance being checked */
                    submod->ext[i]->flags |= LYEXT_OPT_PLUGIN1;
                }
                c++;
            }
        }
    }

    if (c > 1) {
        LYEXT_LOG(ext->module->ctx, LY_LLERR, "Annotations",
                  "Annotation instance %s is not unique, there are %d instances with the same name in module %s.",
                  ext->arg_value, c, ((struct lys_module *)ext->parent)->name);
        return 1;
    } else {
        return 0;
    }
}